

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<capnp::TwoPartyVatNetwork::IncomingMessageImpl>::dispose
          (Own<capnp::TwoPartyVatNetwork::IncomingMessageImpl> *this)

{
  IncomingMessageImpl *this_00;
  Disposer *in_RDX;
  
  this_00 = this->ptr;
  if (this_00 != (IncomingMessageImpl *)0x0) {
    this->ptr = (IncomingMessageImpl *)0x0;
    Disposer::Dispose_<capnp::TwoPartyVatNetwork::IncomingMessageImpl,_true>::dispose
              ((Dispose_<capnp::TwoPartyVatNetwork::IncomingMessageImpl,_true> *)this_00,
               (IncomingMessageImpl *)this->disposer,in_RDX);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }